

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::ShaderPerformanceCase::iterate(ShaderPerformanceCase *this)

{
  Result RVar1;
  int iVar2;
  InitialCalibration *pIVar3;
  IterateResult IVar4;
  int iVar5;
  
  IVar4 = STOP;
  if ((this->m_program->m_program).m_info.linkOk == true) {
    ShaderPerformanceMeasurer::iterate(&this->m_measurer);
    IVar4 = CONTINUE;
    if ((this->m_measurer).m_state == STATE_FINISHED) {
      ShaderPerformanceMeasurer::logMeasurementInfo
                (&this->m_measurer,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
      pIVar3 = (this->m_initialCalibration).m_ptr;
      if (pIVar3 != (InitialCalibration *)0x0) {
        iVar2 = (this->m_measurer).m_calibrator.m_measureState.numDrawCalls;
        iVar5 = 1;
        if (1 < iVar2) {
          iVar5 = iVar2;
        }
        pIVar3->initialNumCalls = iVar5;
      }
      RVar1 = (this->m_measurer).m_result;
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])(RVar1,RVar1.megaFragPerSec,this);
      IVar4 = STOP;
    }
  }
  return IVar4;
}

Assistant:

ShaderPerformanceCase::IterateResult ShaderPerformanceCase::iterate (void)
{
	DE_ASSERT(m_program);

	if (!m_program->isOk()) // This happens when compilation failed in init().
		return STOP;

	m_measurer.iterate();

	if (m_measurer.isFinished())
	{
		m_measurer.logMeasurementInfo(m_testCtx.getLog());

		if (m_initialCalibration)
			m_initialCalibration->initialNumCalls = de::max(1, m_measurer.getFinalCallCount());

		const ShaderPerformanceMeasurer::Result result = m_measurer.getResult();
		reportResult(result.megaVertPerSec, result.megaFragPerSec);
		return STOP;
	}
	else
		return CONTINUE;
}